

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

bool __thiscall
SoftHSM::isMechanismPermitted(SoftHSM *this,OSObject *key,CK_MECHANISM_PTR pMechanism)

{
  _Rb_tree_header *p_Var1;
  _List_node_base *p_Var2;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *__x;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  bool bVar5;
  list<unsigned_long,_std::allocator<unsigned_long>_> mechs;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> allowed;
  OSAttribute attribute;
  list<unsigned_long,_std::allocator<unsigned_long>_> local_108;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_f0;
  OSAttribute local_c0;
  
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            (&local_108,&this->supportedMechanisms);
  p_Var2 = local_108.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node
           .super__List_node_base._M_next;
  if (local_108.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&local_108) {
    do {
      if (p_Var2[1]._M_next == (_List_node_base *)pMechanism->mechanism) break;
      p_Var2 = p_Var2->_M_next;
    } while (p_Var2 != (_List_node_base *)&local_108);
  }
  if (p_Var2 == (_List_node_base *)&local_108) {
    bVar5 = false;
  }
  else {
    (*key->_vptr_OSObject[3])(&local_c0,key,0x40000600);
    __x = &OSAttribute::getMechanismTypeSetValue(&local_c0)->_M_t;
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::_Rb_tree(&local_f0,__x);
    if (local_f0._M_impl.super__Rb_tree_header._M_node_count == 0) {
      bVar5 = true;
    }
    else {
      p_Var1 = &local_f0._M_impl.super__Rb_tree_header;
      p_Var3 = &p_Var1->_M_header;
      if (local_f0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        do {
          bVar5 = *(ulong *)(local_f0._M_impl.super__Rb_tree_header._M_header._M_parent + 1) <
                  pMechanism->mechanism;
          if (!bVar5) {
            p_Var3 = local_f0._M_impl.super__Rb_tree_header._M_header._M_parent;
          }
          local_f0._M_impl.super__Rb_tree_header._M_header._M_parent =
               (&(local_f0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_left)[bVar5];
        } while (local_f0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0);
      }
      p_Var4 = p_Var1;
      if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
         (p_Var4 = (_Rb_tree_header *)p_Var3,
         pMechanism->mechanism < ((_Rb_tree_header *)p_Var3)->_M_node_count)) {
        p_Var4 = p_Var1;
      }
      bVar5 = p_Var4 != p_Var1;
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree(&local_f0);
    OSAttribute::~OSAttribute(&local_c0);
  }
  if (local_108.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&local_108) {
    do {
      p_Var2 = (local_108.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                _M_node.super__List_node_base._M_next)->_M_next;
      operator_delete(local_108.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl._M_node.super__List_node_base._M_next);
      local_108.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
      super__List_node_base._M_next = p_Var2;
    } while (p_Var2 != (_List_node_base *)&local_108);
  }
  return bVar5;
}

Assistant:

bool SoftHSM::isMechanismPermitted(OSObject* key, CK_MECHANISM_PTR pMechanism)
{
	std::list<CK_MECHANISM_TYPE> mechs = supportedMechanisms;
	/* First check if the algorithm is enabled in the global configuration */
	auto it = std::find(mechs.begin(), mechs.end(), pMechanism->mechanism);
	if (it == mechs.end())
		return false;

	OSAttribute attribute = key->getAttribute(CKA_ALLOWED_MECHANISMS);
	std::set<CK_MECHANISM_TYPE> allowed = attribute.getMechanismTypeSetValue();

	if (allowed.empty()) {
		return true;
	}

	return allowed.find(pMechanism->mechanism) != allowed.end();
}